

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::IEEEFloat::normalize
          (IEEEFloat *this,roundingMode rounding_mode,lostFraction lost_fraction)

{
  bool bVar1;
  uint uVar2;
  opStatus oVar3;
  lostFraction moreSignificant;
  lostFraction local_28;
  lostFraction lf;
  int exponentChange;
  uint omsb;
  lostFraction lost_fraction_local;
  roundingMode rounding_mode_local;
  IEEEFloat *this_local;
  
  bVar1 = isFiniteNonZero(this);
  if (!bVar1) {
    return opOK;
  }
  uVar2 = significandMSB(this);
  lf = uVar2 + lfLessThanHalf;
  exponentChange = lost_fraction;
  if (lf != lfExactlyZero) {
    local_28 = lf - this->semantics->precision;
    if ((int)this->semantics->maxExponent < (int)((int)this->exponent + local_28)) {
      oVar3 = handleOverflow(this,rounding_mode);
      return oVar3;
    }
    if ((int)((int)this->exponent + local_28) < (int)this->semantics->minExponent) {
      local_28 = (int)this->semantics->minExponent - (int)this->exponent;
    }
    if ((int)local_28 < 0) {
      if (lost_fraction == lfExactlyZero) {
        shiftSignificandLeft(this,-local_28);
        return opOK;
      }
      __assert_fail("lost_fraction == lfExactlyZero",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x516,
                    "IEEEFloat::opStatus llvm::detail::IEEEFloat::normalize(roundingMode, lostFraction)"
                   );
    }
    if (0 < (int)local_28) {
      moreSignificant = shiftSignificandRight(this,local_28);
      exponentChange = combineLostFractions(moreSignificant,lost_fraction);
      if (local_28 < lf) {
        lf = lf - local_28;
      }
      else {
        lf = lfExactlyZero;
      }
    }
  }
  if (exponentChange == 0) {
    if (lf == lfExactlyZero) {
      this->field_0x12 = this->field_0x12 & 0xf8 | 3;
    }
    this_local._4_4_ = opOK;
  }
  else {
    bVar1 = roundAwayFromZero(this,rounding_mode,exponentChange,0);
    if (bVar1) {
      if (lf == lfExactlyZero) {
        this->exponent = this->semantics->minExponent;
      }
      incrementSignificand(this);
      uVar2 = significandMSB(this);
      lf = uVar2 + lfLessThanHalf;
      if (lf == this->semantics->precision + lfLessThanHalf) {
        if (this->exponent == this->semantics->maxExponent) {
          this->field_0x12 = this->field_0x12 & 0xf8;
          return opInexact|opOverflow;
        }
        shiftSignificandRight(this,1);
        return opInexact;
      }
    }
    if (lf == this->semantics->precision) {
      this_local._4_4_ = opInexact;
    }
    else {
      if (this->semantics->precision <= lf) {
        __assert_fail("omsb < semantics->precision",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x559,
                      "IEEEFloat::opStatus llvm::detail::IEEEFloat::normalize(roundingMode, lostFraction)"
                     );
      }
      if (lf == lfExactlyZero) {
        this->field_0x12 = this->field_0x12 & 0xf8 | 3;
      }
      this_local._4_4_ = opInexact|opUnderflow;
    }
  }
  return this_local._4_4_;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::normalize(roundingMode rounding_mode,
                                         lostFraction lost_fraction) {
  unsigned int omsb;                /* One, not zero, based MSB.  */
  int exponentChange;

  if (!isFiniteNonZero())
    return opOK;

  /* Before rounding normalize the exponent of fcNormal numbers.  */
  omsb = significandMSB() + 1;

  if (omsb) {
    /* OMSB is numbered from 1.  We want to place it in the integer
       bit numbered PRECISION if possible, with a compensating change in
       the exponent.  */
    exponentChange = omsb - semantics->precision;

    /* If the resulting exponent is too high, overflow according to
       the rounding mode.  */
    if (exponent + exponentChange > semantics->maxExponent)
      return handleOverflow(rounding_mode);

    /* Subnormal numbers have exponent minExponent, and their MSB
       is forced based on that.  */
    if (exponent + exponentChange < semantics->minExponent)
      exponentChange = semantics->minExponent - exponent;

    /* Shifting left is easy as we don't lose precision.  */
    if (exponentChange < 0) {
      assert(lost_fraction == lfExactlyZero);

      shiftSignificandLeft(-exponentChange);

      return opOK;
    }

    if (exponentChange > 0) {
      lostFraction lf;

      /* Shift right and capture any new lost fraction.  */
      lf = shiftSignificandRight(exponentChange);

      lost_fraction = combineLostFractions(lf, lost_fraction);

      /* Keep OMSB up-to-date.  */
      if (omsb > (unsigned) exponentChange)
        omsb -= exponentChange;
      else
        omsb = 0;
    }
  }

  /* Now round the number according to rounding_mode given the lost
     fraction.  */

  /* As specified in IEEE 754, since we do not trap we do not report
     underflow for exact results.  */
  if (lost_fraction == lfExactlyZero) {
    /* Canonicalize zeroes.  */
    if (omsb == 0)
      category = fcZero;

    return opOK;
  }

  /* Increment the significand if we're rounding away from zero.  */
  if (roundAwayFromZero(rounding_mode, lost_fraction, 0)) {
    if (omsb == 0)
      exponent = semantics->minExponent;

    incrementSignificand();
    omsb = significandMSB() + 1;

    /* Did the significand increment overflow?  */
    if (omsb == (unsigned) semantics->precision + 1) {
      /* Renormalize by incrementing the exponent and shifting our
         significand right one.  However if we already have the
         maximum exponent we overflow to infinity.  */
      if (exponent == semantics->maxExponent) {
        category = fcInfinity;

        return (opStatus) (opOverflow | opInexact);
      }

      shiftSignificandRight(1);

      return opInexact;
    }
  }

  /* The normal case - we were and are not denormal, and any
     significand increment above didn't overflow.  */
  if (omsb == semantics->precision)
    return opInexact;

  /* We have a non-zero denormal.  */
  assert(omsb < semantics->precision);

  /* Canonicalize zeroes.  */
  if (omsb == 0)
    category = fcZero;

  /* The fcZero case is a denormal that underflowed to zero.  */
  return (opStatus) (opUnderflow | opInexact);
}